

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-reader.c
# Opt level: O2

int check_long_utf16(void)

{
  uchar uVar1;
  int iVar2;
  uchar *input;
  ulong uVar3;
  uint uVar4;
  byte bVar5;
  yaml_parser_t parser;
  
  input = (uchar *)malloc(0x30d42);
  if (input == (uchar *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/tests/test-reader.c"
                  ,0x11f,"int check_long_utf16(void)");
  }
  puts("checking a long utf16 sequence...");
  input[0] = 0xff;
  input[1] = 0xfe;
  for (uVar3 = 0; (int)uVar3 != 100000; uVar3 = uVar3 + 1) {
    uVar1 = '\x10';
    if ((uVar3 & 1) == 0) {
      uVar1 = '/';
    }
    input[uVar3 * 2 + 2] = uVar1;
    input[uVar3 * 2 + 3] = '\x04';
  }
  yaml_parser_initialize(&parser);
  yaml_parser_set_input_string(&parser,input,0x30d42);
  for (uVar4 = 0; uVar4 != 100000; uVar4 = uVar4 + 1) {
    if (parser.unread == 0) {
      iVar2 = yaml_parser_update_buffer(&parser,1);
      if (iVar2 == 0) goto LAB_00102819;
      if (parser.unread == 0) {
        printf("\tnot enough characters at %d\n",(ulong)uVar4);
        goto LAB_00102843;
      }
    }
    bVar5 = 0x90;
    if ((uVar4 & 1) == 0) {
      bVar5 = 0xaf;
    }
    uVar3 = (ulong)*parser.buffer.pointer;
    if (*parser.buffer.pointer != 0xd0) {
LAB_00102804:
      printf("\tincorrect UTF-8 sequence: %X %X instead of %X %X\n",uVar3,
             (ulong)parser.buffer.pointer[1],0xd0);
      goto LAB_00102843;
    }
    if (bVar5 != parser.buffer.pointer[1]) {
      uVar3 = 0xd0;
      goto LAB_00102804;
    }
    parser.buffer.pointer = parser.buffer.pointer + 2;
    parser.unread = parser.unread - 1;
  }
  iVar2 = yaml_parser_update_buffer(&parser,1);
  if (iVar2 == 0) {
LAB_00102819:
    printf("\treader error: %s at %ld\n",parser.problem,parser.problem_offset);
  }
  else {
    if (*parser.buffer.pointer == 0) {
      uVar4 = 0;
      goto LAB_00102846;
    }
    printf("\texpected NUL, found %X (eof=%d, unread=%ld)\n",(ulong)*parser.buffer.pointer,
           (ulong)(uint)parser.eof,parser.unread);
  }
LAB_00102843:
  uVar4 = 1;
LAB_00102846:
  yaml_parser_delete(&parser);
  free(input);
  printf("checking a long utf16 sequence: %d fail(s)\n",(ulong)uVar4);
  return uVar4;
}

Assistant:

int check_long_utf16(void)
{
    yaml_parser_t parser;
    int k = 0;
    int j;
    int failed = 0;
    unsigned char ch0, ch1;
    unsigned char *buffer = (unsigned char *)malloc(2+LONG*2);
    assert(buffer);
    printf("checking a long utf16 sequence...\n");
    buffer[k++] = '\xff';
    buffer[k++] = '\xfe';
    for (j = 0; j < LONG; j ++) {
        if (j % 2) {
            buffer[k++] = '\x10';
            buffer[k++] = '\x04';
        }
        else {
            buffer[k++] = '/';
            buffer[k++] = '\x04';
        }
    }
    yaml_parser_initialize(&parser);
    yaml_parser_set_input_string(&parser, buffer, 2+LONG*2);
    for (k = 0; k < LONG; k++) {
        if (!parser.unread) {
            if (!yaml_parser_update_buffer(&parser, 1)) {
                printf("\treader error: %s at %ld\n", parser.problem, (long)parser.problem_offset);
                failed = 1;
                break;
            }
        }
        if (!parser.unread) {
            printf("\tnot enough characters at %d\n", k);
            failed = 1;
            break;
        }
        if (k % 2) {
            ch0 = '\xd0';
            ch1 = '\x90';
        }
        else {
            ch0 = '\xd0';
            ch1 = '\xaf';
        }
        if (parser.buffer.pointer[0] != ch0 || parser.buffer.pointer[1] != ch1) {
            printf("\tincorrect UTF-8 sequence: %X %X instead of %X %X\n",
                    (int)parser.buffer.pointer[0], (int)parser.buffer.pointer[1],
                    (int)ch0, (int)ch1);
            failed = 1;
            break;
        }
        parser.buffer.pointer += 2;
        parser.unread -= 1;
    }
    if (!failed) {
        if (!yaml_parser_update_buffer(&parser, 1)) {
            printf("\treader error: %s at %ld\n", parser.problem, (long)parser.problem_offset);
            failed = 1;
        }
        else if (parser.buffer.pointer[0] != '\0') {
            printf("\texpected NUL, found %X (eof=%d, unread=%ld)\n", (int)parser.buffer.pointer[0], parser.eof, (long)parser.unread);
            failed = 1;
        }
    }
    yaml_parser_delete(&parser);
    free(buffer);
    printf("checking a long utf16 sequence: %d fail(s)\n", failed);
    return failed;
}